

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_color_write
          (Impl *this,Value *state,VkPipelineColorWriteCreateInfoEXT **out_info)

{
  Number in_RAX;
  VkPipelineColorWriteCreateInfoEXT *pVVar1;
  Type pGVar2;
  Number NVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  pVVar1 = (VkPipelineColorWriteCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkPipelineColorWriteCreateInfoEXT *)0x0) {
    *(undefined8 *)&pVVar1->attachmentCount = 0;
    pVVar1->pColorWriteEnables = (VkBool32 *)0x0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"attachmentCount");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->attachmentCount = (pGVar2->data_).s.length;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffd8,(Ch *)state);
    NVar3.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(state);
    if (local_28 != NVar3.i64) {
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"colorWriteEnables");
      parse_uints(this,pGVar2,&pVVar1->pColorWriteEnables);
    }
    return true;
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_color_write(const Value &state,
                                            VkPipelineColorWriteCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineColorWriteCreateInfoEXT>();
	*out_info = info;

	info->attachmentCount = state["attachmentCount"].GetUint();

	// Could be null for dynamic state.
	if (state.HasMember("colorWriteEnables"))
	{
		auto &enables = state["colorWriteEnables"];
		static_assert(sizeof(VkBool32) == sizeof(uint32_t), "VkBool32 is not 32-bit.");
		if (!parse_uints(enables, reinterpret_cast<const VkBool32 **>(&info->pColorWriteEnables)))
			return false;
	}

	return true;
}